

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O1

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  uint uVar5;
  long lVar6;
  Mat *this_00;
  size_t sVar7;
  size_t sVar8;
  pointer pMVar9;
  undefined1 auVar10 [12];
  int *piVar11;
  Rect RVar12;
  pointer pRVar13;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar14;
  undefined4 uVar15;
  int iVar16;
  undefined1 (*pauVar17) [16];
  long lVar18;
  ulong uVar19;
  float *pfVar20;
  pointer pRVar21;
  void *pvVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  void *pvVar25;
  void *pvVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  int _c;
  void *pvVar30;
  ulong uVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float in_XMM5_Db;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  vector<float,_std::allocator<float>_> scores;
  Mat proposals;
  void *ptr;
  undefined1 local_258 [12];
  float fStack_24c;
  unsigned_long *local_248;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_238;
  unsigned_long local_220;
  vector<float,_std::allocator<float>_> local_218;
  undefined1 (*local_1f8) [16];
  undefined8 uStack_1f0;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  long *local_1d8;
  undefined8 uStack_1d0;
  uint local_1c8;
  uint uStack_1c4;
  ulong uStack_1c0;
  pointer local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  undefined1 (*local_1a0) [16];
  uint local_198;
  float local_194;
  float local_190;
  float local_18c;
  vector<float,_std::allocator<float>_> local_188;
  undefined4 uStack_170;
  long *local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  long local_150;
  float local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  ulong local_130;
  void *local_128;
  void *local_120;
  undefined1 (*local_118) [16];
  void *local_110;
  void *local_108;
  void *local_100;
  ulong local_f8;
  ulong local_f0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  void *local_a8;
  void *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  undefined1 local_48 [24];
  
  local_1b8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_f8 = (ulong)local_1b8->w;
  local_f0 = (ulong)(uint)local_1b8->h;
  uVar5 = (this->anchors).h;
  uVar29 = local_1b8->h * local_1b8->w;
  auVar36._4_4_ = -(uint)(uVar5 == 0);
  auVar36._0_4_ = -(uint)(uVar29 == 0);
  auVar36._8_8_ = 0;
  movmskps(3,auVar36 << 0x40);
  local_1f8 = (undefined1 (*) [16])0x0;
  uStack_1f0._0_4_ = 0;
  uStack_1f0._4_4_ = 0;
  uStack_1f0 = (int *)0x0;
  uStack_1e8 = 4;
  uStack_1e4 = 0;
  uStack_1e0 = 1;
  local_1d8 = (long *)0x0;
  local_1c8 = uVar29;
  uStack_1d0 = 0x400000003;
  uStack_1c4 = uVar5;
  uStack_1c0 = (long)(int)(uVar29 * 4) & 0x3ffffffffffffffc;
  lVar18 = uStack_1c0 * (long)(int)uVar5;
  local_e8 = top_blobs;
  if (lVar18 != 0) {
    local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    iVar16 = posix_memalign((void **)&local_188,0x10,lVar18 * 4 + 4);
    if (iVar16 != 0) {
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
    }
    local_1f8 = (undefined1 (*) [16])
                local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
    uStack_1f0 = (int *)((undefined1 *)
                         local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar18 * 4);
    *(undefined4 *)
     ((undefined1 *)
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start + lVar18 * 4) = 1;
  }
  local_1b0 = (ulong)uVar5;
  local_198 = uVar5;
  local_130 = (ulong)uVar29;
  if (0 < (int)uVar5) {
    uVar31 = local_f8 & 0xffffffff;
    local_108 = local_1b8[1].data;
    lVar18 = local_1b8[1].cstep * local_1b8[1].elemsize;
    local_194 = (float)this->feat_stride;
    local_118 = local_1f8;
    local_e0 = (long)(this->anchors).w * (this->anchors).elemsize;
    lVar27 = (long)uStack_1d0._4_4_ * CONCAT44(uStack_1e4,uStack_1e8);
    local_d0 = CONCAT44(uStack_1e4,uStack_1e8) * uStack_1c0;
    local_100 = (this->anchors).data;
    local_b8 = lVar27 * local_f8;
    local_120 = (void *)(lVar18 * 3 + (long)local_108);
    local_d8 = lVar18 * 4;
    local_c0 = local_f8 * 4;
    local_128 = (void *)((long)local_108 + lVar18 * 2);
    local_110 = (void *)(lVar18 + (long)local_108);
    local_1a8 = 0;
    do {
      if (0 < (int)local_f0) {
        local_c8 = local_1a8 * local_e0;
        uVar3 = *(undefined8 *)((long)local_100 + local_c8 + 8);
        fVar38 = (float)uVar3 - (float)*(undefined8 *)((long)local_100 + local_c8);
        fVar42 = (float)((ulong)*(undefined8 *)((long)local_100 + local_c8) >> 0x20);
        fVar39 = (float)((ulong)uVar3 >> 0x20) - fVar42;
        fStack_80 = fVar38 * 0.5;
        fStack_7c = fVar39 * 0.5;
        local_190 = (float)this->feat_stride;
        local_1a0 = local_118;
        uVar19 = 0;
        local_78 = CONCAT44(fVar39,fVar38);
        uStack_70 = 0;
        pvVar22 = local_110;
        pvVar25 = local_120;
        pvVar26 = local_108;
        pvVar30 = local_128;
        fVar44 = fVar42;
        fVar40 = fVar42;
        fVar37 = fVar42;
        local_98 = fVar39;
        fStack_94 = fVar39;
        fStack_90 = fVar39;
        fStack_8c = fVar39;
        fStack_84 = in_XMM5_Db;
        do {
          local_b0 = uVar19;
          if (0 < (int)local_f8) {
            fVar41 = *(float *)((long)local_100 + local_c8);
            uStack_144 = 0;
            uStack_140 = 0;
            uStack_13c = 0;
            uVar19 = 0;
            pauVar17 = local_1a0;
            local_a8 = pvVar25;
            local_a0 = pvVar22;
            local_68 = fVar42;
            fStack_64 = fVar44;
            fStack_60 = fVar40;
            fStack_5c = fVar37;
            do {
              local_18c = *(float *)((long)local_a8 + uVar19 * 4);
              local_48._0_4_ = (*(float *)((long)local_a0 + uVar19 * 4) + 0.5) * fVar39;
              local_48._4_4_ = 0;
              local_48._8_4_ = (*(float *)((long)pvVar26 + uVar19 * 4) + 0.5) * fVar38;
              local_48._12_4_ = 0;
              local_148 = fVar41;
              local_58 = expf(*(float *)((long)pvVar30 + uVar19 * 4));
              fVar38 = expf(local_18c);
              fVar42 = (float)local_48._8_4_ + local_148;
              fVar44 = (float)local_48._0_4_ + local_68;
              fVar39 = local_58 * fStack_80;
              fVar38 = fVar38 * fStack_7c;
              auVar33._4_4_ = fVar38;
              auVar33._0_4_ = fVar39;
              auVar33._8_4_ = fVar42;
              auVar33._12_4_ = fVar44;
              auVar10._4_8_ = auVar33._8_8_;
              auVar10._0_4_ = fVar38 + local_68 * fStack_84;
              auVar34._0_8_ = auVar10._0_8_ << 0x20;
              auVar34._8_4_ = fVar42 + fVar39;
              auVar34._12_4_ = fVar44 + fVar38;
              *(ulong *)*pauVar17 = CONCAT44(fVar44 - fVar38,fVar42 - fVar39);
              *(long *)(*pauVar17 + 8) = auVar34._8_8_;
              fVar41 = local_148 + local_190;
              uVar19 = uVar19 + 1;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + lVar27);
              pvVar22 = local_a0;
              pvVar25 = local_a8;
              fVar38 = (float)local_78;
              in_XMM5_Db = fStack_84;
              fVar39 = local_98;
              fVar42 = local_68;
              fVar44 = fStack_64;
              fVar40 = fStack_60;
              fVar37 = fStack_5c;
            } while (uVar31 != uVar19);
          }
          fVar42 = fVar42 + local_194;
          uVar19 = local_b0 + 1;
          local_1a0 = (undefined1 (*) [16])(*local_1a0 + local_b8);
          pvVar25 = (void *)((long)pvVar25 + local_c0);
          pvVar30 = (void *)((long)pvVar30 + local_c0);
          pvVar22 = (void *)((long)pvVar22 + local_c0);
          pvVar26 = (void *)((long)pvVar26 + local_c0);
        } while (uVar19 != local_f0);
      }
      local_1a8 = local_1a8 + 1;
      local_118 = (undefined1 (*) [16])(*local_118 + local_d0);
      local_120 = (void *)((long)local_120 + local_d8);
      local_128 = (void *)((long)local_128 + local_d8);
      local_110 = (void *)((long)local_110 + local_d8);
      local_108 = (void *)((long)local_108 + local_d8);
    } while (local_1a8 != local_1b0);
  }
  uVar31 = local_130 & 0xffffffff;
  if (0 < (int)local_198) {
    fVar38 = (float)*local_1b8[2].data;
    fVar39 = (float)((ulong)*local_1b8[2].data >> 0x20);
    auVar35._0_4_ = fVar39 + -1.0;
    auVar35._4_4_ = fVar38 + -1.0;
    auVar35._8_4_ = fVar39 + -1.0;
    auVar35._12_4_ = fVar38 + -1.0;
    uVar19 = 0;
    pauVar17 = local_1f8;
    do {
      uVar23 = uVar31;
      pauVar24 = pauVar17;
      if (0 < (int)local_130) {
        do {
          auVar36 = minps(*pauVar24,auVar35);
          auVar36 = maxps(auVar36,ZEXT816(0));
          *pauVar24 = auVar36;
          pauVar24 = (undefined1 (*) [16])
                     (*pauVar24 + (long)uStack_1d0._4_4_ * CONCAT44(uStack_1e4,uStack_1e8));
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
      }
      uVar19 = uVar19 + 1;
      pauVar17 = (undefined1 (*) [16])(*pauVar17 + CONCAT44(uStack_1e4,uStack_1e8) * uStack_1c0);
    } while (uVar19 != local_1b0);
  }
  local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Rect *)0x0;
  local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (0 < (int)local_198) {
    local_148 = (float)this->min_size * *(float *)((long)local_1b8[2].data + 8);
    uVar23 = 0;
    uVar19 = local_1b0;
    do {
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(*local_1f8 + uStack_1c0 * uVar23 * CONCAT44(uStack_1e4,uStack_1e8));
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = uStack_1e8;
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = uStack_1e4;
      uStack_170 = uStack_1e0;
      local_168 = local_1d8;
      local_160._0_4_ = 2;
      uVar15 = (undefined4)local_160;
      local_160._0_4_ = 2;
      local_160._4_4_ = uStack_1d0._4_4_;
      uStack_158 = CONCAT44(1,local_1c8);
      local_150 = (long)(int)(local_1c8 * uStack_1d0._4_4_);
      if (0 < (int)local_130) {
        pfVar20 = (float *)(local_1b8->elemsize * local_1b8->cstep * uVar19 + (long)local_1b8->data)
        ;
        uVar28 = 0;
        do {
          lVar18 = (long)(int)uVar28 * (long)local_160._4_4_ *
                   CONCAT44(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_4_);
          if ((local_148 <=
               (*(float *)((long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start + lVar18 + 8) + 1.0) -
               *(float *)((long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar18)) &&
             (local_148 <=
              (*(float *)((long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar18 + 0xc) + 1.0) -
              *(float *)((long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar18 + 4))) {
            local_258._4_4_ =
                 *(float *)((long)local_188.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar18 + 4);
            local_258._0_4_ =
                 *(pointer)((long)local_188.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar18);
            local_258._8_4_ =
                 *(undefined4 *)
                  ((long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar18 + 8);
            fStack_24c = *(float *)((long)local_188.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start + lVar18 + 0xc);
            RVar12 = _local_258;
            if (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<ncnn::Rect,std::allocator<ncnn::Rect>>::
              _M_realloc_insert<ncnn::Rect_const&>
                        ((vector<ncnn::Rect,std::allocator<ncnn::Rect>> *)&local_238,
                         (iterator)
                         local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Rect *)local_258);
            }
            else {
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x1 =
                   *(pointer)((long)local_188.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar18);
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y1 = (float)local_258._4_4_;
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x2 = (float)local_258._8_4_;
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y2 = fStack_24c;
              local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
              _local_258 = RVar12;
            }
            if (local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_218,
                         (iterator)
                         local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,pfVar20);
            }
            else {
              *local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish = *pfVar20;
              local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar28 = uVar28 + 1;
          pfVar20 = pfVar20 + 1;
          uVar15 = (undefined4)local_160;
        } while (uVar31 != uVar28);
      }
      local_160._0_4_ = uVar15;
      piVar11 = (int *)CONCAT44(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_168 == (long *)0x0) {
            if (local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              free(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start);
            }
          }
          else {
            (**(code **)(*local_168 + 0x18))();
          }
        }
      }
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 0;
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
      uStack_170 = 0;
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      local_160 = 0;
      uStack_158 = 0;
      local_150 = 0;
      uVar23 = uVar23 + 1;
      uVar19 = uVar19 + 1;
    } while (uVar23 != local_1b0);
  }
  if (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      qsort_descent_inplace<ncnn::Rect>
                (&local_238,&local_218,0,
                 (int)((ulong)((long)local_218.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_218.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  iVar16 = this->pre_nms_topN;
  if (0 < (long)iVar16) {
    if (iVar16 < (int)((ulong)((long)local_238.
                                     super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_238.
                                    super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 4)) {
      std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize(&local_238,(long)iVar16);
      std::vector<float,_std::allocator<float>_>::resize(&local_218,(long)this->pre_nms_topN);
    }
  }
  local_248 = (unsigned_long *)0x0;
  local_258._0_4_ = 0.0;
  local_258._4_4_ = 0.0;
  local_258._8_4_ = 0.0;
  fStack_24c = 0.0;
  local_148 = this->nms_thresh;
  pRVar21 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
            super__Vector_impl_data._M_start;
  pRVar13 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar31 = (long)local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  std::vector<float,_std::allocator<float>_>::vector(&local_188,uVar31,(allocator_type *)&local_220)
  ;
  if (pRVar13 == pRVar21) {
    local_220 = 0;
  }
  else {
    pfVar20 = &(local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_start)->x2;
    lVar18 = 0;
    do {
      uVar2 = ((Rect *)(pfVar20 + -2))->x1;
      uVar4 = ((Rect *)(pfVar20 + -2))->y1;
      *(float *)((undefined1 *)
                 local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar18 * 4) =
           ((float)((ulong)*(undefined8 *)pfVar20 >> 0x20) - (float)uVar4) *
           ((float)*(undefined8 *)pfVar20 - (float)uVar2);
      lVar18 = lVar18 + 1;
      pfVar20 = pfVar20 + 4;
    } while (uVar31 + (uVar31 == 0) != lVar18);
    local_220 = 0;
    if (pRVar13 != pRVar21) {
      do {
        if ((long)stack0xfffffffffffffdb0 - local_258._0_8_ == 0) {
LAB_00138df6:
          if (stack0xfffffffffffffdb0 == local_248) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_258,
                       stack0xfffffffffffffdb0,&local_220);
          }
          else {
            *stack0xfffffffffffffdb0 = local_220;
            stack0xfffffffffffffdb0 = stack0xfffffffffffffdb0 + 1;
          }
        }
        else {
          lVar18 = (long)stack0xfffffffffffffdb0 - local_258._0_8_ >> 3;
          fVar38 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[local_220].x1;
          bVar32 = true;
          lVar27 = 0;
          do {
            lVar6 = *(long *)(local_258._0_8_ + lVar27 * 8);
            fVar39 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar6].x2;
            fVar42 = 0.0;
            if (fVar38 <= fVar39) {
              pRVar21 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar6;
              fVar44 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl
                       .super__Vector_impl_data._M_start[local_220].x2;
              fVar40 = pRVar21->x1;
              if (fVar40 <= fVar44) {
                fVar37 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_start[local_220].y1;
                fVar41 = pRVar21->y2;
                if (fVar37 <= fVar41) {
                  fVar1 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start[local_220].y2;
                  fVar43 = pRVar21->y1;
                  if (fVar43 <= fVar1) {
                    if (fVar44 <= fVar39) {
                      fVar39 = fVar44;
                    }
                    if (fVar40 <= fVar38) {
                      fVar40 = fVar38;
                    }
                    if (fVar1 <= fVar41) {
                      fVar41 = fVar1;
                    }
                    if (fVar43 <= fVar37) {
                      fVar43 = fVar37;
                    }
                    fVar42 = (fVar41 - fVar43) * (fVar39 - fVar40);
                  }
                }
              }
            }
            if (local_148 <
                fVar42 / ((*(float *)((undefined1 *)
                                      local_188.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start + local_220 * 4) -
                          fVar42) +
                         *(float *)((undefined1 *)
                                    local_188.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar6 * 4))) {
              bVar32 = false;
            }
            lVar27 = lVar27 + 1;
          } while (lVar18 + (ulong)(lVar18 == 0) != lVar27);
          if (bVar32) goto LAB_00138df6;
        }
        local_220 = local_220 + 1;
      } while (local_220 < uVar31);
    }
  }
  if ((undefined1 (*) [16])
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (undefined1 (*) [16])0x0) {
    operator_delete(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar14 = local_e8;
  uVar31 = (ulong)((long)stack0xfffffffffffffdb0 - local_258._0_8_) >> 3;
  uVar19 = uVar31 & 0xffffffff;
  if (this->after_nms_topN < (int)uVar31) {
    uVar19 = (ulong)(uint)this->after_nms_topN;
  }
  this_00 = (local_e8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _c = (int)uVar19;
  Mat::create(this_00,4,1,_c,4,(Allocator *)0x0);
  iVar16 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    if (0 < _c) {
      sVar7 = this_00->cstep;
      sVar8 = this_00->elemsize;
      pfVar20 = (float *)((long)this_00->data + 0xc);
      uVar31 = 0;
      do {
        lVar18 = *(long *)(local_258._0_8_ + uVar31 * 8);
        pfVar20[-3] = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar18].x1;
        pfVar20[-2] = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar18].y1;
        pfVar20[-1] = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar18].x2;
        *pfVar20 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar18].y2;
        uVar31 = uVar31 + 1;
        pfVar20 = (float *)((long)pfVar20 + sVar7 * sVar8);
      } while (uVar19 != uVar31);
    }
    pMVar9 = (pvVar14->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (0x40 < (ulong)((long)(pvVar14->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9)) {
      Mat::create(pMVar9 + 1,1,1,_c,4,(Allocator *)0x0);
      if (pMVar9[1].data == (void *)0x0) {
        bVar32 = true;
      }
      else {
        bVar32 = (long)pMVar9[1].c * pMVar9[1].cstep == 0;
      }
      if (bVar32) goto LAB_00138fb4;
      if (0 < _c) {
        pfVar20 = (float *)pMVar9[1].data;
        sVar7 = pMVar9[1].cstep;
        sVar8 = pMVar9[1].elemsize;
        uVar31 = 0;
        do {
          *pfVar20 = local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[*(long *)(local_258._0_8_ + uVar31 * 8)];
          uVar31 = uVar31 + 1;
          pfVar20 = (float *)((long)pfVar20 + sVar7 * sVar8);
        } while (uVar19 != uVar31);
      }
    }
    iVar16 = 0;
  }
LAB_00138fb4:
  if ((void *)local_258._0_8_ != (void *)0x0) {
    operator_delete((void *)local_258._0_8_,(long)local_248 - local_258._0_8_);
  }
  if (local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (uStack_1f0 != (int *)0x0) {
    LOCK();
    *uStack_1f0 = *uStack_1f0 + -1;
    UNLOCK();
    if (*uStack_1f0 == 0) {
      if (local_1d8 == (long *)0x0) {
        if (local_1f8 != (undefined1 (*) [16])0x0) {
          free(local_1f8);
        }
      }
      else {
        (**(code **)(*local_1d8 + 0x18))();
      }
    }
  }
  return iVar16;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i*w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = static_cast<float>(anchor_w * exp(dw));
                float pb_h = static_cast<float>(anchor_h * exp(dh));

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = { pb[0], pb[1], pb[2], pb[3] };
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<size_t> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i=0; i<picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[ picked[i] ].x1;
        outptr[1] = proposal_boxes[ picked[i] ].y1;
        outptr[2] = proposal_boxes[ picked[i] ].x2;
        outptr[3] = proposal_boxes[ picked[i] ].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i=0; i<picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[ picked[i] ];
        }
    }

    return 0;
}